

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::anon_unknown_0::HasSingularString
               (Descriptor *desc,Options *options)

{
  bool bVar1;
  value_type field_00;
  OneofDescriptor *pOVar2;
  Iterator IVar3;
  FieldDescriptor *field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  Options *options_local;
  Descriptor *desc_local;
  
  __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(desc);
  IVar3 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar3.descriptor;
  __end3.descriptor._0_4_ = IVar3.idx;
  IVar3 = FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar3.descriptor;
  field._0_4_ = IVar3.idx;
  while( true ) {
    bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
    if (!bVar1) {
      return false;
    }
    field_00 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                         ((Iterator *)&__end3.descriptor);
    bVar1 = IsString(field_00,options);
    if ((((bVar1) && (bVar1 = IsStringInlined(field_00,options), !bVar1)) &&
        (bVar1 = FieldDescriptor::is_repeated(field_00), !bVar1)) &&
       (pOVar2 = FieldDescriptor::real_containing_oneof(field_00), pOVar2 == (OneofDescriptor *)0x0)
       ) break;
    FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  return true;
}

Assistant:

bool HasSingularString(const Descriptor* desc, const Options& options) {
  for (const auto* field : FieldRange(desc)) {
    if (IsString(field, options) && !IsStringInlined(field, options) &&
        !field->is_repeated() && !field->real_containing_oneof()) {
      return true;
    }
  }
  return false;
}